

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O1

void __thiscall
siamese::RecoveryMatrixState::PopulateRows(RecoveryMatrixState *this,uint oldRows,uint newRows)

{
  ostringstream *this_00;
  RowInfo *pRVar1;
  OutputWorker *this_01;
  RecoveryPacket *pRVar2;
  undefined1 local_1b8 [392];
  
  if (oldRows < newRows) {
    pktalloc::LightVector<siamese::RecoveryMatrixState::RowInfo,_25U>::SetSize_Copy
              (&this->Rows,newRows);
    if (oldRows == 0) {
      pRVar2 = (RecoveryPacket *)&this->CheckedRegion->FirstRecovery;
    }
    else {
      pRVar2 = (this->Rows).DataPtr[(int)(oldRows - 1)].Recovery;
    }
    if (oldRows < newRows) {
      this_00 = (ostringstream *)(local_1b8 + 0x10);
      do {
        pRVar2 = pRVar2->Next;
        pRVar1 = (this->Rows).DataPtr;
        pRVar1[(int)oldRows].Recovery = pRVar2;
        pRVar1[(int)oldRows].UsedForSolution = false;
        pRVar1[(int)oldRows].MatrixColumnCount = pRVar2->LostCount;
        if (DAT_001be020 < 3) {
          local_1b8._0_8_ = Logger;
          local_1b8._8_4_ = Info;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,DAT_001be050,DAT_001be058);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"*** Recovery packet: start=",0x1b);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Sum_Count=",0xb);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," LDPC_Count=",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          this_01 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
        }
        oldRows = oldRows + 1;
      } while (newRows != oldRows);
    }
  }
  return;
}

Assistant:

void RecoveryMatrixState::PopulateRows(const unsigned oldRows, const unsigned newRows)
{
    if (oldRows >= newRows)
        return;

    Rows.SetSize_Copy(newRows);

    RecoveryPacket* recovery;
    if (oldRows > 0)
        recovery = Rows.GetRef(oldRows - 1).Recovery->Next;
    else
        recovery = CheckedRegion->FirstRecovery;
    SIAMESE_DEBUG_ASSERT(recovery);

    for (unsigned rowIndex = oldRows; rowIndex < newRows; ++rowIndex, recovery = recovery->Next)
    {
        RowInfo* rowPtr = Rows.GetPtr(rowIndex);
        rowPtr->Recovery          = recovery;
        rowPtr->UsedForSolution   = false;
        rowPtr->MatrixColumnCount = recovery->LostCount;

        Logger.Info("*** Recovery packet: start=", recovery->Metadata.ColumnStart,  " Sum_Count=",  recovery->Metadata.SumCount,  " LDPC_Count=",  recovery->Metadata.LDPCCount);
    }
}